

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createLvalueSwizzle
          (Builder *this,Id typeId,Id target,Id source,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *channels)

{
  Instruction *pIVar1;
  pointer ppIVar2;
  pointer puVar3;
  uint uVar4;
  Id IVar5;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  uint components [4];
  uint auStack_58 [6];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  long lVar10;
  
  if ((long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start == 4) {
    pIVar1 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[source];
    if (pIVar1 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar1->typeId;
    }
    uVar4 = getNumTypeConstituents(this,IVar5);
    if (uVar4 == 1) {
      IVar5 = createCompositeInsert
                        (this,source,target,typeId,
                         *(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      return IVar5;
    }
  }
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       operator_new(0x60);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_00afab78;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar5;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
       OpVectorShuffle;
  (((_Bit_iterator *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  uVar4 = 0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) =
       (undefined1  [16])0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined1 (*) [16])
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) =
       (undefined1  [16])0x0;
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar1 = ppIVar2[target];
  if (pIVar1 != (Instruction *)0x0) {
    uVar4 = pIVar1->typeId;
  }
  if (ppIVar2[uVar4]->opCode == OpTypeVector) {
    local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_40,2);
    if (*(_Bit_pointer *)
         ((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) ==
        (((vector<bool,_std::allocator<bool>_> *)
         ((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
        super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)this_00.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),2);
    }
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,target);
    pIVar1 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[source];
    if (pIVar1 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar1->typeId;
    }
    uVar4 = getNumTypeConstituents(this,IVar5);
    if ((long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 == (ulong)uVar4) {
      ppIVar2 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar1 = ppIVar2[source];
      if (pIVar1 == (Instruction *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)pIVar1->typeId;
      }
      if (ppIVar2[uVar7]->opCode == OpTypeVector) {
        Instruction::addIdOperand
                  ((Instruction *)
                   this_00.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,source);
        pIVar1 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[target];
        if (pIVar1 == (Instruction *)0x0) {
          IVar5 = 0;
        }
        else {
          IVar5 = pIVar1->typeId;
        }
        uVar4 = getNumTypeConstituents(this,IVar5);
        if (0 < (int)uVar4) {
          lVar10 = (ulong)uVar4 - 1;
          auVar8._8_4_ = (int)lVar10;
          auVar8._0_8_ = lVar10;
          auVar8._12_4_ = (int)((ulong)lVar10 >> 0x20);
          uVar7 = 0;
          auVar8 = auVar8 ^ _DAT_007f27e0;
          auVar9 = _DAT_007f27d0;
          do {
            auVar11 = auVar9 ^ _DAT_007f27e0;
            if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                        auVar8._4_4_ < auVar11._4_4_) & 1)) {
              auStack_58[uVar7] = (uint)uVar7;
            }
            if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
                auVar11._12_4_ <= auVar8._12_4_) {
              auStack_58[uVar7 + 1] = (uint)uVar7 + 1;
            }
            uVar7 = uVar7 + 2;
            lVar10 = auVar9._8_8_;
            auVar9._0_8_ = auVar9._0_8_ + 2;
            auVar9._8_8_ = lVar10 + 2;
          } while ((uVar4 + 1 & 0xfffffffe) != uVar7);
        }
        puVar3 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = (uint)((ulong)((long)(channels->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >>
                      2);
        if (0 < (int)uVar6) {
          uVar7 = 0;
          do {
            auStack_58[puVar3[uVar7]] = uVar4 + (int)uVar7;
            uVar7 = uVar7 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar7);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_40,(long)(int)uVar4)
        ;
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)this_00.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),
                   (long)(int)uVar4);
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            Instruction::addImmediateOperand
                      ((Instruction *)
                       this_00.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
                       auStack_58[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        local_38._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
             (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
        addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                            &local_38);
        if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
            local_38._M_t.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
          (**(code **)(*(long *)local_38._M_t.
                                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))
                    ();
        }
        return *(Id *)((long)this_00.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      }
      __assert_fail("isVector(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xbc7,
                    "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
                   );
    }
    __assert_fail("getNumComponents(source) == channels.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbc6,
                  "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
                 );
  }
  __assert_fail("isVector(target)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xbc2,
                "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
               );
}

Assistant:

Id Builder::createLvalueSwizzle(Id typeId, Id target, Id source, const std::vector<unsigned>& channels)
{
    if (channels.size() == 1 && getNumComponents(source) == 1)
        return createCompositeInsert(source, target, typeId, channels.front());

    Instruction* swizzle = new Instruction(getUniqueId(), typeId, OpVectorShuffle);

    assert(isVector(target));
    swizzle->reserveOperands(2);
    swizzle->addIdOperand(target);

    assert(getNumComponents(source) == channels.size());
    assert(isVector(source));
    swizzle->addIdOperand(source);

    // Set up an identity shuffle from the base value to the result value
    unsigned int components[4];
    int numTargetComponents = getNumComponents(target);
    for (int i = 0; i < numTargetComponents; ++i)
        components[i] = i;

    // Punch in the l-value swizzle
    for (int i = 0; i < (int)channels.size(); ++i)
        components[channels[i]] = numTargetComponents + i;

    // finish the instruction with these components selectors
    swizzle->reserveOperands(numTargetComponents);
    for (int i = 0; i < numTargetComponents; ++i)
        swizzle->addImmediateOperand(components[i]);
    addInstruction(std::unique_ptr<Instruction>(swizzle));

    return swizzle->getResultId();
}